

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::remove_check(Fl_Timeout_Handler cb,void *argp)

{
  Check *pCVar1;
  Check *pCVar2;
  Check *pCVar3;
  Check *pCVar4;
  Check **ppCVar5;
  
  ppCVar5 = &first_check;
  pCVar3 = next_check;
  pCVar4 = free_check;
  while (pCVar1 = *ppCVar5, pCVar1 != (Check *)0x0) {
    if ((pCVar1->cb == cb) && (pCVar1->arg == argp)) {
      pCVar2 = pCVar1->next;
      if (pCVar3 == pCVar1) {
        pCVar3 = pCVar2;
        next_check = pCVar2;
      }
      *ppCVar5 = pCVar2;
      pCVar1->next = pCVar4;
      pCVar4 = pCVar1;
      free_check = pCVar1;
    }
    else {
      ppCVar5 = &pCVar1->next;
    }
  }
  return;
}

Assistant:

void Fl::remove_check(Fl_Timeout_Handler cb, void *argp) {
  for (Check** p = &first_check; *p;) {
    Check* t = *p;
    if (t->cb == cb && t->arg == argp) {
      if (next_check == t) next_check = t->next;
      *p = t->next;
      t->next = free_check;
      free_check = t;
    } else {
      p = &(t->next);
    }
  }
}